

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tif_luv.c
# Opt level: O3

int oog_encode(double u,double v)

{
  float fVar1;
  short sVar2;
  double dVar3;
  int iVar4;
  long lVar5;
  undefined1 *puVar6;
  ulong uVar7;
  double *pdVar8;
  uint uVar9;
  int iVar10;
  undefined1 *puVar11;
  int iVar12;
  double *pdVar13;
  uint uVar14;
  ulong uVar15;
  ulong uVar16;
  bool bVar17;
  double eps [100];
  double adStack_358 [100];
  undefined1 local_38 [8];
  
  if (oog_encode_initialized == '\0') {
    lVar5 = 0x62;
    do {
      adStack_358[lVar5] = 2.0;
      adStack_358[lVar5 + 1] = 2.0;
      lVar5 = lVar5 + -2;
    } while (lVar5 != -2);
    lVar5 = 0xa2;
    do {
      sVar2 = uv_row[lVar5].nus;
      iVar10 = sVar2 + -1;
      iVar12 = iVar10;
      if (lVar5 == 0) {
        iVar12 = 1;
      }
      if (sVar2 < 2) {
        iVar12 = 1;
      }
      if (lVar5 == 0xa2) {
        iVar12 = 1;
      }
      if (0 < sVar2) {
        fVar1 = uv_row[lVar5].ustart;
        do {
          dVar3 = atan2(((double)(int)lVar5 + 0.5) * 0.0035000001080334187 + 0.016939999535679817 +
                        -0.473684211,
                        ((double)iVar10 + 0.5) * 0.0035000001080334187 + (double)fVar1 +
                        -0.210526316);
          dVar3 = dVar3 * 15.915494277358546 + 50.0;
          iVar4 = (int)dVar3;
          dVar3 = ABS(dVar3 - ((double)(int)dVar3 + 0.5));
          if (dVar3 < adStack_358[iVar4]) {
            oog_encode::oog_table[iVar4] = uv_row[lVar5].ncum + iVar10;
            adStack_358[iVar4] = dVar3;
          }
          iVar10 = iVar10 - iVar12;
        } while (-1 < iVar10);
      }
      bVar17 = lVar5 != 0;
      lVar5 = lVar5 + -1;
    } while (bVar17);
    puVar6 = local_38;
    lVar5 = 99;
    uVar7 = 0xc6;
    pdVar8 = eps + 0x57;
    uVar15 = 100;
    do {
      if (1.5 < adStack_358[lVar5]) {
        uVar9 = 1;
        puVar11 = puVar6;
        uVar16 = uVar15;
        do {
          if (*(double *)(puVar11 + (uVar16 / 100) * -800) <= 1.5 &&
              *(double *)(puVar11 + (uVar16 / 100) * -800) != 1.5) goto LAB_002a5d62;
          uVar9 = uVar9 + 1;
          puVar11 = puVar11 + 8;
          uVar16 = uVar16 + 1;
        } while (uVar9 != 0x32);
        uVar9 = 0x32;
LAB_002a5d62:
        uVar14 = 1;
        iVar10 = -1;
        uVar16 = uVar7;
        pdVar13 = pdVar8;
        do {
          if (pdVar13[(uVar16 / 100) * -100] <= 1.5 && pdVar13[(uVar16 / 100) * -100] != 1.5)
          goto LAB_002a5db5;
          uVar14 = uVar14 + 1;
          pdVar13 = pdVar13 + -1;
          uVar16 = uVar16 - 1;
          iVar10 = iVar10 + -1;
        } while (iVar10 != -0x32);
        iVar10 = -0x32;
        uVar14 = 0x32;
LAB_002a5db5:
        iVar12 = uVar9 + (int)(uVar15 - 1);
        if (uVar14 <= uVar9) {
          iVar12 = (int)uVar15 + 99 + iVar10;
        }
        oog_encode::oog_table[lVar5] = oog_encode::oog_table[iVar12 % 100];
      }
      puVar6 = puVar6 + -8;
      pdVar8 = pdVar8 + -1;
      uVar7 = uVar7 - 1;
      bVar17 = lVar5 != 0;
      lVar5 = lVar5 + -1;
      uVar15 = uVar15 - 1;
    } while (bVar17);
    oog_encode_initialized = '\x01';
  }
  dVar3 = atan2(v + -0.473684211,u + -0.210526316);
  return oog_encode::oog_table[(int)(dVar3 * 15.915494277358546 + 50.0)];
}

Assistant:

static int oog_encode(double u, double v) /* encode out-of-gamut chroma */
{
    static int oog_table[NANGLES];
    static int initialized = 0;
    register int i;

    if (!initialized)
    { /* set up perimeter table */
        double eps[NANGLES], ua, va, ang, epsa;
        int ui, vi, ustep;
        for (i = NANGLES; i--;)
            eps[i] = 2.;
        for (vi = UV_NVS; vi--;)
        {
            va = UV_VSTART + (vi + .5) * UV_SQSIZ;
            ustep = uv_row[vi].nus - 1;
            if (vi == UV_NVS - 1 || vi == 0 || ustep <= 0)
                ustep = 1;
            for (ui = uv_row[vi].nus - 1; ui >= 0; ui -= ustep)
            {
                ua = uv_row[vi].ustart + (ui + .5) * UV_SQSIZ;
                ang = uv2ang(ua, va);
                i = (int)ang;
                epsa = fabs(ang - (i + .5));
                if (epsa < eps[i])
                {
                    oog_table[i] = uv_row[vi].ncum + ui;
                    eps[i] = epsa;
                }
            }
        }
        for (i = NANGLES; i--;) /* fill any holes */
            if (eps[i] > 1.5)
            {
                int i1, i2;
                for (i1 = 1; i1 < NANGLES / 2; i1++)
                    if (eps[(i + i1) % NANGLES] < 1.5)
                        break;
                for (i2 = 1; i2 < NANGLES / 2; i2++)
                    if (eps[(i + NANGLES - i2) % NANGLES] < 1.5)
                        break;
                if (i1 < i2)
                    oog_table[i] = oog_table[(i + i1) % NANGLES];
                else
                    oog_table[i] = oog_table[(i + NANGLES - i2) % NANGLES];
            }
        initialized = 1;
    }
    i = (int)uv2ang(u, v); /* look up hue angle */
    return (oog_table[i]);
}